

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O3

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::LimitPercentModifier::Deserialize(LimitPercentModifier *this,Deserializer *deserializer)

{
  int iVar1;
  pointer pLVar2;
  byte bVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::LimitPercentModifier_*,_false> local_38;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  
  local_38._M_head_impl = (LimitPercentModifier *)operator_new(0x20);
  ((local_38._M_head_impl)->super_ResultModifier).type = LIMIT_PERCENT_MODIFIER;
  ((local_38._M_head_impl)->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)&PTR__LimitPercentModifier_0243c5b8;
  ((local_38._M_head_impl)->limit).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  ((local_38._M_head_impl)->offset).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  pLVar2 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
           ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                         *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"limit");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pLVar2->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar2->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var4._M_head_impl != (ParsedExpression *)0x0) goto LAB_01753c51;
    bVar3 = 0;
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      _Var5._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&stack0xffffffffffffffd0,deserializer);
      _Var5._M_head_impl = local_30._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pLVar2->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar2->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var4._M_head_impl == (ParsedExpression *)0x0) {
      bVar3 = 1;
    }
    else {
LAB_01753c51:
      (*((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  pLVar2 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
           ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                         *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"offset");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pLVar2->offset).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar2->offset).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var4._M_head_impl == (ParsedExpression *)0x0) {
      bVar3 = 0;
      goto LAB_01753cfb;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pLVar2->offset).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar2->offset).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var4._M_head_impl == (ParsedExpression *)0x0) {
      bVar3 = 1;
      goto LAB_01753cfb;
    }
  }
  (*((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_01753cfb:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  (this->super_ResultModifier)._vptr_ResultModifier = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> LimitPercentModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LimitPercentModifier>(new LimitPercentModifier());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "limit", result->limit);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(201, "offset", result->offset);
	return std::move(result);
}